

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O2

void __thiscall
wasm_importtype_t::wasm_importtype_t(wasm_importtype_t *this,wasm_importtype_t *other)

{
  ImportType IStack_58;
  
  wabt::interp::ImportType::ImportType(&IStack_58,&other->I);
  wasm_importtype_t(this,&IStack_58);
  wabt::interp::ImportType::~ImportType(&IStack_58);
  return;
}

Assistant:

wasm_importtype_t(const wasm_importtype_t& other)
      : wasm_importtype_t(other.I) {}